

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O3

bool __thiscall Opcode::AABBTree::Refit2(AABBTree *this,AABBTreeBuilder *builder)

{
  AABBTreeNode *pAVar1;
  float *pfVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  if ((builder != (AABBTreeBuilder *)0x0) && ((ulong)this->mTotalNbNodes != 0)) {
    lVar3 = (ulong)this->mTotalNbNodes * 0x30 + -0x30;
    do {
      pAVar1 = this->mPool;
      pfVar2 = (float *)(*(ulong *)((long)&pAVar1->mPos + lVar3) & 0xfffffffffffffffe);
      if (pfVar2 == (float *)0x0) {
        (*builder->_vptr_AABBTreeBuilder[2])
                  (builder,*(undefined8 *)((long)&pAVar1->mNodePrimitives + lVar3),
                   (ulong)*(uint *)((long)&pAVar1->mNbPrimitives + lVar3),
                   (long)&(pAVar1->mBV).mCenter.x + lVar3);
      }
      else {
        fVar10 = (float)*(undefined8 *)(pfVar2 + 4);
        fVar11 = (float)((ulong)*(undefined8 *)(pfVar2 + 4) >> 0x20);
        fVar12 = (float)*(undefined8 *)(pfVar2 + 1);
        fVar18 = (float)((ulong)*(undefined8 *)(pfVar2 + 1) >> 0x20);
        auVar8._0_4_ = fVar12 - fVar10;
        auVar8._4_4_ = fVar18 - fVar11;
        auVar8._8_8_ = 0;
        fVar16 = (float)*(undefined8 *)(pfVar2 + 0xd);
        fVar17 = (float)((ulong)*(undefined8 *)(pfVar2 + 0xd) >> 0x20);
        fVar14 = (float)*(undefined8 *)(pfVar2 + 0x10);
        fVar15 = (float)((ulong)*(undefined8 *)(pfVar2 + 0x10) >> 0x20);
        auVar9._4_4_ = fVar17 - fVar15;
        auVar9._0_4_ = fVar16 - fVar14;
        auVar9._8_8_ = 0;
        auVar9 = minps(auVar8,auVar9);
        fVar13 = *pfVar2 - pfVar2[3];
        fVar10 = fVar10 + fVar12;
        fVar11 = fVar11 + fVar18;
        fVar12 = *pfVar2 + pfVar2[3];
        fVar18 = pfVar2[0xc] - pfVar2[0xf];
        fVar14 = fVar14 + fVar16;
        fVar15 = fVar15 + fVar17;
        fVar16 = pfVar2[0xc] + pfVar2[0xf];
        uVar4 = -(uint)(fVar13 < fVar18);
        uVar5 = -(uint)(fVar14 < fVar10);
        uVar6 = -(uint)(fVar15 < fVar11);
        uVar7 = -(uint)(fVar16 < fVar12);
        fVar13 = (float)(~uVar4 & (uint)fVar18 | (uint)fVar13 & uVar4);
        fVar10 = (float)(~uVar5 & (uint)fVar14 | (uint)fVar10 & uVar5);
        fVar11 = (float)(~uVar6 & (uint)fVar15 | (uint)fVar11 & uVar6);
        fVar12 = (float)(~uVar7 & (uint)fVar16 | (uint)fVar12 & uVar7);
        pfVar2 = (float *)((long)&(pAVar1->mBV).mCenter.x + lVar3);
        *pfVar2 = (fVar12 + fVar13) * 0.5;
        pfVar2[1] = (auVar9._0_4_ + fVar10) * 0.5;
        pfVar2[2] = (auVar9._4_4_ + fVar11) * 0.5;
        pfVar2[3] = (fVar12 - fVar13) * 0.5;
        *(ulong *)((long)&(pAVar1->mBV).mExtents.y + lVar3) =
             CONCAT44((fVar11 - auVar9._4_4_) * 0.5,(fVar10 - auVar9._0_4_) * 0.5);
      }
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != -0x30);
  }
  return builder != (AABBTreeBuilder *)0x0;
}

Assistant:

bool AABBTree::Refit2(AABBTreeBuilder* builder)
{
	// Checkings
	if(!builder)	return false;

	ASSERT(mPool);

	// Bottom-up update
	Point Min,Max;
	Point Min_,Max_;
	udword Index = mTotalNbNodes;
	while(Index--)
	{
		AABBTreeNode& Current = mPool[Index];

		if(Current.IsLeaf())
		{
			builder->ComputeGlobalBox(Current.GetPrimitives(), Current.GetNbPrimitives(), *(AABB*)Current.GetAABB());
		}
		else
		{
			Current.GetPos()->GetAABB()->GetMin(Min);
			Current.GetPos()->GetAABB()->GetMax(Max);

			Current.GetNeg()->GetAABB()->GetMin(Min_);
			Current.GetNeg()->GetAABB()->GetMax(Max_);

			Min.Min(Min_);
			Max.Max(Max_);

			((AABB*)Current.GetAABB())->SetMinMax(Min, Max);
		}
	}
	return true;
}